

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O2

size_t __thiscall
MADPComponentDiscreteObservations::GetNrObservations
          (MADPComponentDiscreteObservations *this,Index agentI)

{
  pointer puVar1;
  ostream *poVar2;
  E *pEVar3;
  stringstream ss;
  ostream local_188 [376];
  
  if (this->_m_initialized == false) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<(local_188,"MADPComponentDiscreteObservations::GetNrObservations(");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,") - Error: not initialized. ");
    std::endl<char,std::char_traits<char>>(poVar2);
    pEVar3 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar3,&ss);
    __cxa_throw(pEVar3,&E::typeinfo,E::~E);
  }
  puVar1 = (this->_m_nrObservations).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)agentI <
      (ulong)((long)(this->_m_nrObservations).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return puVar1[agentI];
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_188,
                           "Warning: MADPComponentDiscreteObservations::GetNrObservations(");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,") - index out of bounds");
  std::endl<char,std::char_traits<char>>(poVar2);
  pEVar3 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar3,&ss);
  __cxa_throw(pEVar3,&E::typeinfo,E::~E);
}

Assistant:

size_t MADPComponentDiscreteObservations::GetNrObservations(Index agentI) const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteObservations::GetNrObservations("<< 
            agentI<<") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    if(agentI < _m_nrObservations.size())
        return _m_nrObservations[agentI];
    else
    {
        stringstream ss;
        ss << "Warning: MADPComponentDiscreteObservations::GetNrObservations("<<
            agentI<<") - index out of bounds"<<endl;
        throw E(ss);
    }
}